

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NetworkUpdateParameters::InternalSwap
          (NetworkUpdateParameters *this,NetworkUpdateParameters *other)

{
  NetworkUpdateParameters *other_local;
  NetworkUpdateParameters *this_local;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->losslayers_).super_RepeatedPtrFieldBase,
             &(other->losslayers_).super_RepeatedPtrFieldBase);
  std::swap<CoreML::Specification::Optimizer*>(&this->optimizer_,&other->optimizer_);
  std::swap<CoreML::Specification::Int64Parameter*>(&this->epochs_,&other->epochs_);
  std::swap<CoreML::Specification::BoolParameter*>(&this->shuffle_,&other->shuffle_);
  std::swap<CoreML::Specification::Int64Parameter*>(&this->seed_,&other->seed_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void NetworkUpdateParameters::InternalSwap(NetworkUpdateParameters* other) {
  losslayers_.InternalSwap(&other->losslayers_);
  std::swap(optimizer_, other->optimizer_);
  std::swap(epochs_, other->epochs_);
  std::swap(shuffle_, other->shuffle_);
  std::swap(seed_, other->seed_);
  std::swap(_cached_size_, other->_cached_size_);
}